

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

void calc_sad_update_bestmv
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,MV_COST_PARAMS *mv_cost_params,
               FULLPEL_MV *best_mv,FULLPEL_MV center_mv,uint8_t *center_address,uint *bestsad,
               uint *raw_bestsad,int search_step,int *best_site,int num_candidates,int cand_start,
               int *cost_list)

{
  buf_2d *pbVar1;
  search_site_config *psVar2;
  int iVar3;
  uint this_sad;
  long lVar4;
  FULLPEL_MV local_6c;
  buf_2d *local_68;
  FULLPEL_MOTION_SEARCH_PARAMS *local_60;
  MV_COST_PARAMS *local_58;
  FULLPEL_MV *local_50;
  uint8_t *local_48;
  uint *local_40;
  long local_38;
  
  local_38 = (long)num_candidates;
  local_68 = (ms_params->ms_buffers).ref;
  pbVar1 = (ms_params->ms_buffers).src;
  psVar2 = ms_params->search_sites;
  local_60 = ms_params;
  local_58 = mv_cost_params;
  local_50 = best_mv;
  local_48 = center_address;
  local_40 = bestsad;
  for (lVar4 = (long)cand_start; lVar4 < local_38; lVar4 = lVar4 + 1) {
    local_6c.col = psVar2->site[search_step][lVar4].mv.col + center_mv.col;
    local_6c.row = psVar2->site[search_step][lVar4].mv.row + center_mv.row;
    iVar3 = av1_is_fullmv_in_range(&ms_params->mv_limits,local_6c);
    if (iVar3 != 0) {
      this_sad = (*local_60->sdf)(pbVar1->buf,pbVar1->stride,
                                  local_48 + psVar2->site[search_step][lVar4].offset,
                                  local_68->stride);
      if (cost_list != (int *)0x0) {
        cost_list[lVar4 + 1] = this_sad;
      }
      iVar3 = update_mvs_and_sad(this_sad,&local_6c,local_58,local_40,raw_bestsad,local_50,
                                 (FULLPEL_MV *)0x0);
      if (iVar3 != 0) {
        *best_site = (int)lVar4;
      }
    }
  }
  return;
}

Assistant:

static inline void calc_sad_update_bestmv(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const MV_COST_PARAMS *mv_cost_params, FULLPEL_MV *best_mv,
    const FULLPEL_MV center_mv, const uint8_t *center_address,
    unsigned int *bestsad, unsigned int *raw_bestsad, int search_step,
    int *best_site, const int num_candidates, int cand_start, int *cost_list) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site *site = ms_params->search_sites->site[search_step];
  // Loop over number of candidates.
  for (int i = cand_start; i < num_candidates; i++) {
    const FULLPEL_MV this_mv = { center_mv.row + site[i].mv.row,
                                 center_mv.col + site[i].mv.col };
    if (!av1_is_fullmv_in_range(&ms_params->mv_limits, this_mv)) continue;
    int thissad = get_mvpred_sad(ms_params, src,
                                 center_address + site[i].offset, ref->stride);
    if (cost_list) {
      cost_list[i + 1] = thissad;
    }
    const int found_better_mv = update_mvs_and_sad(
        thissad, &this_mv, mv_cost_params, bestsad, raw_bestsad, best_mv,
        /*second_best_mv=*/NULL);
    if (found_better_mv) *best_site = i;
  }
}